

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

char * base64_encode(char *buffer,uint len)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  pcVar2 = (char *)calloc(1,(ulong)((len * 4) / 3 + 4));
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0;
    for (; len != 0; len = len - 3) {
      bVar1 = *buffer;
      pcVar2[lVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      if (len == 1) {
        buffer = (char *)((byte *)buffer + 1);
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)((byte *)buffer)[1];
        buffer = (char *)((byte *)buffer + 2);
      }
      pcVar2[lVar3 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [uVar5 >> 4 | (bVar1 & 3) << 4];
      uVar4 = (uint)lVar3;
      if (len == 1) {
        pcVar2[uVar4 + 2] = '=';
        uVar4 = uVar4 | 3;
LAB_00105168:
        lVar3 = lVar3 + 4;
        pcVar2[uVar4] = '=';
        break;
      }
      uVar6 = 0;
      if (len != 2) {
        uVar6 = (uint)(byte)*buffer;
        buffer = (char *)((byte *)buffer + 1);
      }
      pcVar2[lVar3 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uVar6 >> 6) + (uVar5 & 0xf) * 4];
      if (len == 2) {
        uVar4 = uVar4 + 3;
        goto LAB_00105168;
      }
      pcVar2[lVar3 + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar6 & 0x3f];
      lVar3 = lVar3 + 4;
    }
    pcVar2[(int)lVar3] = '\0';
  }
  return pcVar2;
}

Assistant:

static char *
base64_encode(char *buffer, unsigned int len)
{
    char * buf;
    int buflen = 0;
    int c1, c2, c3;
    int maxlen = len*4/3 + 4;
#ifdef OVERKILL
    maxlen = len*2 + 2;
#endif

    buf = malloc(maxlen * sizeof(char));
    if(buf == NULL) {
	return NULL;
    } else {
	memset(buf, 0, maxlen * sizeof(char));
    }

    while (len) {
	
	c1 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[c1>>2];

	if (--len == 0) c2 = 0;
	else c2 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[((c1 & 0x3)<< 4) | ((c2 & 0xf0) >> 4)];

	if (len == 0) {
	    buf[buflen++] = '=';
	    buf[buflen++] = '=';
	    break;
	}

	if (--len == 0) c3 = 0;
	else c3 = (unsigned char)*buffer++;

	buf[buflen++] = num_to_char[((c2 & 0xf) << 2) | ((c3 & 0xc0) >>6)];
	if (len == 0) {
	    buf[buflen++] = '=';

	    break;
	}

	--len;
	buf[buflen++] = num_to_char[c3 & 0x3f];

    }

    buf[buflen]=0;

    return buf;
}